

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::SquareMatrix<4>::operator<(SquareMatrix<4> *this,SquareMatrix<4> *m2)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  byte in_CL;
  long lVar4;
  
  uVar3 = 0;
  do {
    if (uVar3 == 4) {
LAB_00466da3:
      return (bool)(uVar3 < 4 & in_CL);
    }
    lVar4 = 0;
    while (lVar4 != 4) {
      fVar1 = (*(Float (*) [4])*(Float (*) [4])this)[lVar4];
      fVar2 = (*(Float (*) [4])*(Float (*) [4])m2)[lVar4];
      lVar4 = lVar4 + 1;
      if (fVar1 != fVar2) {
        in_CL = fVar1 < fVar2;
        goto LAB_00466da3;
      }
    }
    uVar3 = uVar3 + 1;
    this = (SquareMatrix<4> *)((long)this + 0x10);
    m2 = (SquareMatrix<4> *)((long)m2 + 0x10);
    in_CL = 4;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }